

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O2

int run_test_shutdown_close_pipe(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_110;
  uv_pipe_t h;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&h,0);
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,&h,"/tmp/uv-test-sock",connect_cb);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      if (connect_cb_called == 1) {
        if (shutdown_cb_called == 1) {
          if (close_cb_called == 1) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uStack_110 = 0x6a;
          }
          else {
            pcVar3 = "close_cb_called == 1";
            uStack_110 = 0x68;
          }
        }
        else {
          pcVar3 = "shutdown_cb_called == 1";
          uStack_110 = 0x67;
        }
      }
      else {
        pcVar3 = "connect_cb_called == 1";
        uStack_110 = 0x66;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_110 = 100;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_110 = 0x61;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-shutdown-close.c"
          ,uStack_110,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(shutdown_close_pipe) {
  uv_pipe_t h;
  int r;

  r = uv_pipe_init(uv_default_loop(), &h, 0);
  ASSERT(r == 0);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_cb);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(shutdown_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}